

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

int __thiscall smf::MidiMessage::getKeyNumber(MidiMessage *this)

{
  byte *pbVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = isNote(this);
  pbVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar1;
  if (bVar2) {
    if (uVar3 < 2) {
      return -1;
    }
  }
  else {
    if (uVar3 != 3) {
      return -1;
    }
    if ((*pbVar1 & 0xf0) != 0xa0) {
      return -1;
    }
  }
  return (uint)pbVar1[1];
}

Assistant:

int MidiMessage::getKeyNumber(void) const {
	if (isNote() || isAftertouch()) {
		int output = getP1();
		if (output < 0) {
			return output;
		} else {
			return 0xff & output;
		}
	} else {
		return -1;
	}
}